

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O0

string_t duckdb::SubstringGrapheme(Vector *result,string_t input,int64_t offset,int64_t length)

{
  bool bVar1;
  char *pcVar2;
  idx_t in;
  unsigned_long uVar3;
  size_t in_00;
  long in_RCX;
  int64_t in_stack_00000010;
  int64_t in_stack_00000018;
  GraphemeCluster cluster;
  GraphemeClusterIterator __end1;
  GraphemeClusterIterator __begin1;
  GraphemeIterator *__range1;
  idx_t end_pos;
  idx_t start_pos;
  int64_t current_character;
  idx_t num_characters;
  idx_t i;
  idx_t ascii_end;
  bool is_ascii;
  int64_t end;
  int64_t start;
  idx_t input_size;
  char *input_data;
  int64_t *in_stack_fffffffffffffee8;
  GraphemeClusterIterator *in_stack_fffffffffffffef0;
  int64_t in_stack_fffffffffffffef8;
  int64_t in_stack_ffffffffffffff00;
  GraphemeCluster in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff18;
  Vector *in_stack_ffffffffffffff20;
  GraphemeClusterIterator local_c8;
  undefined1 in_stack_ffffffffffffff58 [16];
  idx_t local_90;
  unsigned_long local_88;
  long local_80;
  ulong local_70;
  long local_58;
  long local_50;
  string_t local_20;
  anon_union_16_2_67f50693_for_value local_10;
  
  pcVar2 = string_t::GetData((string_t *)in_stack_fffffffffffffef0);
  in = string_t::GetSize(&local_20);
  AssertInSupportedRange(cluster.start,in_stack_00000018,in_stack_00000010);
  UnsafeNumericCast<long,unsigned_long,void>(in);
  bVar1 = SubstringStartEnd(in_stack_ffffffffffffff08.start,in_stack_ffffffffffffff00,
                            in_stack_fffffffffffffef8,(int64_t *)in_stack_fffffffffffffef0,
                            in_stack_fffffffffffffee8);
  if (bVar1) {
    bVar1 = true;
    uVar3 = UnsafeNumericCast<unsigned_long,long,void>(local_58 + 1);
    uVar3 = MinValue<unsigned_long>(uVar3,in);
    for (local_70 = 0; local_70 < uVar3; local_70 = local_70 + 1) {
      if (((int)pcVar2[local_70] & 0x80U) != 0) {
        bVar1 = false;
        break;
      }
    }
    if (bVar1) {
      local_10.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           SubstringSlice(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                          in_stack_ffffffffffffff08.end,in_stack_ffffffffffffff08.start);
    }
    else {
      if (in_RCX < 0) {
        in_00 = Utf8Proc::GraphemeCount
                          (in_stack_ffffffffffffff58._8_8_,in_stack_ffffffffffffff58._0_8_);
        UnsafeNumericCast<long,unsigned_long,void>(in_00);
        SubstringStartEnd(in_stack_ffffffffffffff08.start,in_stack_ffffffffffffff00,
                          in_stack_fffffffffffffef8,(int64_t *)in_stack_fffffffffffffef0,
                          in_stack_fffffffffffffee8);
      }
      local_80 = 0;
      local_88 = 0xffffffffffffffff;
      Utf8Proc::GraphemeClusters
                ((char *)in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
      GraphemeIterator::begin((GraphemeIterator *)in_stack_fffffffffffffef0);
      GraphemeIterator::end((GraphemeIterator *)in_stack_fffffffffffffef0);
      while (bVar1 = GraphemeIterator::GraphemeClusterIterator::operator!=
                               (&local_c8,(GraphemeClusterIterator *)&stack0xffffffffffffff18),
            local_90 = in, bVar1) {
        in_stack_ffffffffffffff08 =
             GraphemeIterator::GraphemeClusterIterator::operator*
                       ((GraphemeClusterIterator *)in_stack_ffffffffffffff08.start);
        local_90 = in_stack_ffffffffffffff08.start;
        uVar3 = local_90;
        if ((local_80 != local_50) && (uVar3 = local_88, local_80 == local_58)) break;
        local_88 = uVar3;
        local_80 = local_80 + 1;
        GraphemeIterator::GraphemeClusterIterator::operator++(in_stack_fffffffffffffef0);
      }
      if (local_88 == 0xffffffffffffffff) {
        local_10.pointer =
             (anon_struct_16_3_d7536bce_for_pointer)SubstringEmptyString((Vector *)0x137f1a9);
      }
      else {
        UnsafeNumericCast<long,unsigned_long,void>(local_88);
        UnsafeNumericCast<long,unsigned_long,void>(local_90 - local_88);
        local_10.pointer =
             (anon_struct_16_3_d7536bce_for_pointer)
             SubstringSlice(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                            in_stack_ffffffffffffff08.end,in_stack_ffffffffffffff08.start);
      }
    }
  }
  else {
    local_10.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)SubstringEmptyString((Vector *)0x137ef3c);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_10.pointer;
}

Assistant:

string_t SubstringGrapheme(Vector &result, string_t input, int64_t offset, int64_t length) {
	auto input_data = input.GetData();
	auto input_size = input.GetSize();

	AssertInSupportedRange(input_size, offset, length);

	// we don't know yet if the substring is ascii, but we assume it is (for now)
	// first get the start and end as if this was an ascii string
	int64_t start, end;
	if (!SubstringStartEnd(UnsafeNumericCast<int64_t>(input_size), offset, length, start, end)) {
		return SubstringEmptyString(result);
	}

	// now check if all the characters between 0 and end are ascii characters
	// note that we scan one further to check for a potential combining diacritics (e.g. i + diacritic is ï)
	bool is_ascii = true;
	idx_t ascii_end = MinValue<idx_t>(UnsafeNumericCast<idx_t>(end + 1), input_size);
	for (idx_t i = 0; i < ascii_end; i++) {
		if (input_data[i] & 0x80) {
			// found a non-ascii character: eek
			is_ascii = false;
			break;
		}
	}
	if (is_ascii) {
		// all characters are ascii, we can just slice the substring
		return SubstringSlice(result, input_data, start, end - start);
	}
	// if the characters are not ascii, we need to scan grapheme clusters
	// first figure out which direction we need to scan
	// offset = 0 case is taken care of in SubstringStartEnd
	if (offset < 0) {
		// negative offset, this case is more difficult
		// we first need to count the number of characters in the string
		idx_t num_characters = Utf8Proc::GraphemeCount(input_data, input_size);
		// now call substring start and end again, but with the number of unicode characters this time
		SubstringStartEnd(UnsafeNumericCast<int64_t>(num_characters), offset, length, start, end);
	}

	// now scan the graphemes of the string to find the positions of the start and end characters
	int64_t current_character = 0;
	idx_t start_pos = DConstants::INVALID_INDEX, end_pos = input_size;
	for (auto cluster : Utf8Proc::GraphemeClusters(input_data, input_size)) {
		if (current_character == start) {
			start_pos = cluster.start;
		} else if (current_character == end) {
			end_pos = cluster.start;
			break;
		}
		current_character++;
	}
	if (start_pos == DConstants::INVALID_INDEX) {
		return SubstringEmptyString(result);
	}
	// after we have found these, we can slice the substring
	return SubstringSlice(result, input_data, UnsafeNumericCast<int64_t>(start_pos),
	                      UnsafeNumericCast<int64_t>(end_pos - start_pos));
}